

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O0

Dataset * __thiscall
notch::pre::OneHotEncoder::unapply
          (Dataset *__return_storage_ptr__,OneHotEncoder *this,Dataset *dataIn)

{
  pointer this_00;
  bool bVar1;
  size_type __n;
  reference __v;
  value_type local_80;
  undefined1 local_70 [8];
  Array a;
  const_iterator __end2;
  const_iterator __begin2;
  Dataset *__range2;
  undefined1 local_38 [8];
  Dataset dOut;
  Dataset *dataIn_local;
  OneHotEncoder *this_local;
  
  dOut.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)dataIn;
  core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)local_38);
  __n = core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::size
                  ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)
                   dOut.
                   super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::reserve
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)local_38,__n);
  bVar1 = std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::empty
                    ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)
                     dOut.
                     super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = dOut.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (bVar1) {
    std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
              ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)
               __return_storage_ptr__,
               (vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)
               dOut.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    __end2._M_current =
         (valarray<float> *)
         core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::begin
                   ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)
                    dOut.
                    super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    a._M_data = (float *)core::std::
                         vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::end
                                   ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                                     *)this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::valarray<float>_*,_std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>_>
                                  *)&a._M_data);
      if (!bVar1) break;
      __v = __gnu_cxx::
            __normal_iterator<const_std::valarray<float>_*,_std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>_>
            ::operator*(&__end2);
      core::std::valarray<float>::valarray((valarray<float> *)local_70,__v);
      (*(this->super_ADatasetTransformer)._vptr_ADatasetTransformer[3])(&local_80,this,local_70);
      std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::push_back
                ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)local_38,
                 &local_80);
      core::std::valarray<float>::~valarray((valarray<float> *)&local_80);
      core::std::valarray<float>::~valarray((valarray<float> *)local_70);
      __gnu_cxx::
      __normal_iterator<const_std::valarray<float>_*,_std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>_>
      ::operator++(&__end2);
    }
    std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
              ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)
               __return_storage_ptr__,
               (vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)local_38);
  }
  core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual Dataset unapply(const Dataset &dataIn) {
        Dataset dOut;
        dOut.reserve(dataIn.size());
        if (dataIn.empty()) {
            return dataIn;
        }
        for (Array a : dataIn) {
            dOut.push_back(unapply(a));
        }
        return dOut;
    }